

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O3

void __thiscall
CRenderTools::RenderTilemap
          (CRenderTools *this,CTile *pTiles,int w,int h,float Scale,vec4 Color,int RenderFlags,
          ENVELOPE_EVAL pfnEval,void *pUser,int ColorEnv,int ColorEnvOffset)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float aChannels [4];
  float local_c0;
  float local_bc;
  float local_98;
  float fStack_94;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_88;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_84;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_78;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_74;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float fStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[6])
            (this->m_pGraphics,&local_4c,&local_50,&local_54,&local_58);
  if (ColorEnv < 0) {
    local_98 = 1.0;
    fStack_94 = 1.0;
    local_c0 = 1.0;
    local_bc = 1.0;
  }
  else {
    (*pfnEval)((float)ColorEnvOffset / 1000.0,ColorEnv,&local_48,pUser);
    local_bc = local_48;
    local_c0 = local_44;
    local_98 = local_40;
    fStack_94 = fStack_3c;
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_78 = Color.field_0;
  aStack_74 = Color.field_1;
  local_88 = Color.field_2;
  aStack_84 = Color.field_3;
  fStack_94 = fStack_94 * aStack_84.w;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (local_bc * local_78.x * fStack_94,aStack_74.y * local_c0 * fStack_94,
             fStack_94 * local_98 * local_88.z);
  uVar5 = (int)(local_50 / Scale) - 1;
  if ((int)uVar5 <= (int)(local_58 / Scale)) {
    uVar2 = (int)(local_4c / Scale) - 1;
    do {
      if ((int)uVar2 <= (int)(local_54 / Scale)) {
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = uVar5;
        }
        if (h <= (int)uVar6) {
          uVar6 = h - 1;
        }
        uVar7 = uVar2;
        do {
          if ((RenderFlags & 4U) == 0) {
            uVar8 = uVar7;
            if ((((int)uVar5 < h) && ((int)uVar7 < w)) && (uVar3 = uVar5, -1 < (int)(uVar7 | uVar5))
               ) goto LAB_0018a2a3;
          }
          else {
            uVar8 = 0;
            if (0 < (int)uVar7) {
              uVar8 = uVar7;
            }
            uVar3 = uVar6;
            if (w <= (int)uVar8) {
              uVar8 = w - 1;
            }
LAB_0018a2a3:
            iVar4 = uVar3 * w + uVar8;
            if (pTiles[iVar4].m_Index != '\0') {
              bVar1 = pTiles[iVar4].m_Flags;
              if ((fStack_94 <= 0.99607843) || ((bVar1 & 4) == 0)) {
                uVar8 = RenderFlags & 2;
              }
              else {
                uVar8 = RenderFlags & 1;
              }
              if (uVar8 != 0) {
                uVar16 = 0;
                uVar14 = 0x3f800000;
                uVar10 = 0;
                if ((bVar1 & 1) != 0) {
                  uVar14 = 0;
                  uVar10 = 0x3f800000;
                }
                if ((bVar1 & 2) == 0) {
                  uVar13 = 0;
                  uVar16 = 0x3f800000;
                }
                else {
                  uVar13 = 0x3f800000;
                }
                uVar11 = uVar13;
                uVar12 = uVar14;
                uVar15 = uVar10;
                if ((bVar1 & 8) != 0) {
                  uVar11 = uVar16;
                  uVar12 = uVar10;
                  uVar16 = uVar13;
                  uVar15 = uVar14;
                }
                (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
                          (uVar10,uVar11,uVar12,uVar13,uVar14,uVar16,uVar15);
                local_48 = (float)(int)uVar7 * Scale;
                local_44 = (float)(int)uVar5 * Scale;
                local_40 = Scale;
                fStack_3c = Scale;
                (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])
                          (this->m_pGraphics,&local_48,1);
              }
            }
            uVar8 = uVar7 + pTiles[iVar4].m_Skip;
          }
          uVar7 = uVar8 + 1;
        } while ((int)uVar8 < (int)(local_54 / Scale));
      }
      bVar9 = uVar5 != (int)(local_58 / Scale);
      uVar5 = uVar5 + 1;
    } while (bVar9);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderTilemap(const CTile *pTiles, int w, int h, float Scale, vec4 Color, int RenderFlags,
									ENVELOPE_EVAL pfnEval, void *pUser, int ColorEnv, int ColorEnvOffset)
{
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	float r=1, g=1, b=1, a=1;
	if(ColorEnv >= 0)
	{
		float aChannels[4];
		pfnEval(ColorEnvOffset/1000.0f, ColorEnv, aChannels, pUser);
		r = aChannels[0];
		g = aChannels[1];
		b = aChannels[2];
		a = aChannels[3];
	}

	Graphics()->QuadsBegin();
	const float Alpha = Color.a*a;
	Graphics()->SetColor(Color.r*r*Alpha, Color.g*g*Alpha, Color.b*b*Alpha, Alpha);

	int StartY = (int)(ScreenY0/Scale)-1;
	int StartX = (int)(ScreenX0/Scale)-1;
	int EndY = (int)(ScreenY1/Scale)+1;
	int EndX = (int)(ScreenX1/Scale)+1;

	for(int y = StartY; y < EndY; y++)
		for(int x = StartX; x < EndX; x++)
		{
			int mx = x;
			int my = y;

			if(RenderFlags&TILERENDERFLAG_EXTEND)
			{
				if(mx<0)
					mx = 0;
				if(mx>=w)
					mx = w-1;
				if(my<0)
					my = 0;
				if(my>=h)
					my = h-1;
			}
			else
			{
				if(mx<0)
					continue; // mx = 0;
				if(mx>=w)
					continue; // mx = w-1;
				if(my<0)
					continue; // my = 0;
				if(my>=h)
					continue; // my = h-1;
			}

			int c = mx + my*w;

			unsigned char Index = pTiles[c].m_Index;
			if(Index)
			{
				unsigned char Flags = pTiles[c].m_Flags;

				bool Render = false;
				if(Flags&TILEFLAG_OPAQUE && Color.a*a > 254.0f/255.0f)
				{
					if(RenderFlags&LAYERRENDERFLAG_OPAQUE)
						Render = true;
				}
				else
				{
					if(RenderFlags&LAYERRENDERFLAG_TRANSPARENT)
						Render = true;
				}

				if(Render)
				{
					float x0 = 0;
					float y0 = 0;
					float x1 = 1;
					float y1 = 0;
					float x2 = 1;
					float y2 = 1;
					float x3 = 0;
					float y3 = 1;

					if(Flags&TILEFLAG_VFLIP)
					{
						x0 = x2;
						x1 = x3;
						x2 = x3;
						x3 = x0;
					}

					if(Flags&TILEFLAG_HFLIP)
					{
						y0 = y3;
						y2 = y1;
						y3 = y1;
						y1 = y0;
					}

					if(Flags&TILEFLAG_ROTATE)
					{
						float Tmp = x0;
						x0 = x3;
						x3 = x2;
						x2 = x1;
						x1 = Tmp;
						Tmp = y0;
						y0 = y3;
						y3 = y2;
						y2 = y1;
						y1 = Tmp;
					}

					Graphics()->QuadsSetSubsetFree(x0, y0, x1, y1, x2, y2, x3, y3, Index);
					IGraphics::CQuadItem QuadItem(x*Scale, y*Scale, Scale, Scale);
					Graphics()->QuadsDrawTL(&QuadItem, 1);
				}
			}
			x += pTiles[c].m_Skip;
		}

	Graphics()->QuadsEnd();
}